

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arf_freq_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dc822a::ArfFreqTestLarge::PreEncodeFrameHook
          (ArfFreqTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  int in_stack_00000048;
  int in_stack_0000004c;
  Encoder *in_stack_00000050;
  
  iVar1 = (**(code **)(*in_RSI + 0x40))();
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    if (*(int *)(in_RDI + 0x420) != 0) {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    }
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      encoder->Control(AV1E_SET_TILE_COLUMNS, 4);
      encoder->Control(AOME_SET_CPUUSED, test_encode_param_.cpu_used);
      encoder->Control(AV1E_SET_MIN_GF_INTERVAL, min_arf_requested_);
      if (test_encode_param_.mode != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }